

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

void __thiscall Matrix<int>::Matrix(Matrix<int> *this,int a,int b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  int **ppiVar4;
  int *piVar5;
  int local_24;
  int local_20;
  int j;
  int i_1;
  int i;
  int b_local;
  int a_local;
  Matrix<int> *this_local;
  
  this->n = a;
  this->m = b;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->n;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppiVar4 = (int **)operator_new__(uVar3);
  this->M = ppiVar4;
  for (j = 0; j < this->n; j = j + 1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)this->m;
    uVar3 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    piVar5 = (int *)operator_new__(uVar3);
    this->M[j] = piVar5;
  }
  for (local_20 = 0; local_20 < this->n; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < this->m; local_24 = local_24 + 1) {
      this->M[local_20][local_24] = 0;
    }
  }
  return;
}

Assistant:

Matrix(int a, int b) {
    n = a;
    m = b;
    M = new T*[n];
    for (int i = 0; i < n; i++) {
      M[i] = new T[m];
    }
    for (int i = 0; i < n; i++) {
      for (int j = 0; j < m; j++) {
        M[i][j] = 0;
      }
    }
  }